

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_splitter.cpp
# Opt level: O3

VertexWeightTable * ComputeVertexBoneWeightTable(aiMesh *pMesh)

{
  aiBone *paVar1;
  ulong *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  VertexWeightTable *__s;
  pair<unsigned_int,_float> local_38;
  
  if (((pMesh == (aiMesh *)0x0) || (pMesh->mNumVertices == 0)) ||
     (uVar3 = pMesh->mNumBones, uVar3 == 0)) {
    __s = (VertexWeightTable *)0x0;
  }
  else {
    uVar4 = (ulong)pMesh->mNumVertices;
    puVar2 = (ulong *)operator_new__(uVar4 * 0x18 + 8);
    *puVar2 = uVar4;
    __s = (VertexWeightTable *)(puVar2 + 1);
    uVar5 = 0;
    memset(__s,0,((uVar4 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
    do {
      paVar1 = pMesh->mBones[uVar5];
      if (paVar1->mNumWeights != 0) {
        uVar4 = 0;
        do {
          local_38 = (pair<unsigned_int,_float>)
                     ((ulong)(uint)paVar1->mWeights[uVar4].mWeight << 0x20 | uVar5);
          std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
          emplace_back<std::pair<unsigned_int,float>>
                    ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                      *)(__s + paVar1->mWeights[uVar4].mVertexId),&local_38);
          uVar4 = uVar4 + 1;
        } while (uVar4 < paVar1->mNumWeights);
        uVar3 = pMesh->mNumBones;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  return __s;
}

Assistant:

VertexWeightTable* ComputeVertexBoneWeightTable(const aiMesh* pMesh) {
	if (!pMesh || !pMesh->mNumVertices || !pMesh->mNumBones) {
		return nullptr;
	}

	VertexWeightTable* const avPerVertexWeights = new VertexWeightTable[pMesh->mNumVertices];
	for (unsigned int i = 0; i < pMesh->mNumBones;++i)	{

		aiBone* bone = pMesh->mBones[i];
		for (unsigned int a = 0; a < bone->mNumWeights;++a)	{
			const aiVertexWeight& weight = bone->mWeights[a];
			avPerVertexWeights[weight.mVertexId].push_back( std::make_pair(i,weight.mWeight) );
		}
	}
	return avPerVertexWeights;
}